

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DnsStats.cpp
# Opt level: O0

uint32_t __thiscall
DnsStats::CountDnsNameParts(DnsStats *this,uint8_t *packet,uint32_t length,uint32_t start)

{
  uint uVar1;
  uint32_t local_2c;
  uint32_t new_start;
  uint32_t nb_parts;
  uint32_t name_start;
  uint32_t l;
  uint32_t start_local;
  uint32_t length_local;
  uint8_t *packet_local;
  DnsStats *this_local;
  
  local_2c = 0;
  name_start = start;
  do {
    while( true ) {
      if ((length <= name_start) || (uVar1 = (uint)packet[name_start], uVar1 == 0)) {
        return local_2c;
      }
      if ((uVar1 & 0xc0) == 0xc0) break;
      if (0x3f < uVar1) {
        return local_2c;
      }
      if (length < name_start + uVar1 + 1) {
        return local_2c;
      }
      local_2c = local_2c + 1;
      name_start = uVar1 + 1 + name_start;
    }
    if (length < name_start + 2) {
      return local_2c;
    }
    name_start = (uVar1 & 0x3f) * 0x100 + (uint)packet[name_start + 1];
  } while (name_start < start);
  return local_2c;
}

Assistant:

uint32_t DnsStats::CountDnsNameParts(uint8_t* packet, uint32_t length, uint32_t start)
{
    uint32_t l = 0;
    uint32_t name_start = start;
    uint32_t nb_parts = 0;

    while (start < length) {
        l = packet[start];

        if (l == 0)
        {
            /* end of parsing*/
            break;
        }
        else if ((l & 0xC0) == 0xC0)
        {
            if ((start + 2) > length)
            {
                /* error */
                break;
            }
            else
            {
                uint32_t new_start = ((l & 63) << 8) + packet[start + 1];

                if (new_start < name_start)
                {
                    start = new_start;
                }
                else {
                    /* Basic restriction to avoid name decoding loops */
                    break;
                }
            }
        }
        else if (l > 0x3F)
        {
            /* found an extension. Don't know how to parse it! */
            break;
        }
        else
        {
            /* add a label to the name. */
            if (start + l + 1 > length)
            {
                /* format error */
                break;
            }
            else
            {
                nb_parts++;
                start += l + 1;
            }
        }
    }


    return nb_parts;
}